

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiWindowSettings * ImGui::CreateNewWindowSettings(char *name)

{
  ImU32 IVar1;
  ImVector<ImGuiWindowSettings> *this;
  ImGuiWindowSettings *pIVar2;
  ImGuiContext *pIVar3;
  char *pcVar4;
  char *p;
  ImGuiWindowSettings *settings;
  ImGuiContext *local_18;
  ImGuiContext *g;
  char *name_local;
  
  local_18 = GImGui;
  this = &GImGui->SettingsWindows;
  g = (ImGuiContext *)name;
  ImGuiWindowSettings::ImGuiWindowSettings((ImGuiWindowSettings *)&settings);
  ImVector<ImGuiWindowSettings>::push_back(this,(ImGuiWindowSettings *)&settings);
  pIVar2 = ImVector<ImGuiWindowSettings>::back(&local_18->SettingsWindows);
  pIVar3 = (ImGuiContext *)strstr(&g->Initialized,"###");
  if (pIVar3 != (ImGuiContext *)0x0) {
    g = pIVar3;
  }
  pcVar4 = ImStrdup(&g->Initialized);
  pIVar2->Name = pcVar4;
  IVar1 = ImHashStr(&g->Initialized,0,0);
  pIVar2->ID = IVar1;
  return pIVar2;
}

Assistant:

ImGuiWindowSettings* ImGui::CreateNewWindowSettings(const char* name)
{
    ImGuiContext& g = *GImGui;
    g.SettingsWindows.push_back(ImGuiWindowSettings());
    ImGuiWindowSettings* settings = &g.SettingsWindows.back();
#if !IMGUI_DEBUG_INI_SETTINGS
    // Skip to the "###" marker if any. We don't skip past to match the behavior of GetID()
    // Preserve the full string when IMGUI_DEBUG_INI_SETTINGS is set to make .ini inspection easier.
    if (const char* p = strstr(name, "###"))
        name = p;
#endif
    settings->Name = ImStrdup(name);
    settings->ID = ImHashStr(name);
    return settings;
}